

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall TPZMatrix<Fad<double>_>::Decompose_LDLt(TPZMatrix<Fad<double>_> *this)

{
  byte bVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int k;
  ulong uVar6;
  long lVar7;
  long local_150;
  undefined1 local_140 [16];
  Fad<double> sum_1;
  undefined1 local_100 [32];
  Fad<double> tmp;
  Fad<double> sum;
  undefined1 local_a0 [16];
  Fad<double> val;
  undefined1 local_70 [32];
  Fad<double> local_50;
  
  bVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if (bVar1 != 0) {
    if (bVar1 == 4) {
      return (uint)bVar1;
    }
    Error("Decompose_LDLt <Matrix already Decomposed with other scheme> ",(char *)0x0);
  }
  uVar3 = (this->super_TPZBaseMatrix).fRow;
  if (uVar3 != (this->super_TPZBaseMatrix).fCol) {
    Error("Decompose_LDLt <Matrix must be square>",(char *)0x0);
    uVar3 = (this->super_TPZBaseMatrix).fRow;
  }
  uVar4 = 0;
  if (0 < (int)uVar3) {
    uVar4 = uVar3 & 0xffffffff;
  }
  local_150 = 1;
  uVar5 = 0;
  while (uVar5 != uVar4) {
    sum.val_ = 0.0;
    sum.dx_.num_elts = 0;
    sum.dx_.ptr_to_data = (double *)0x0;
    sum.defaultVal = 0.0;
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&tmp,this,uVar6,uVar6);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&sum_1,this,uVar6,uVar5);
      local_100._0_8_ = &tmp;
      local_100._8_8_ = &sum_1;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&val,this,uVar6,uVar5);
      local_70._0_8_ = local_100;
      local_70._8_8_ = &val;
      Fad<double>::operator+=
                (&sum,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_70);
      Fad<double>::~Fad(&val);
      Fad<double>::~Fad(&sum_1);
      Fad<double>::~Fad(&tmp);
    }
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&sum_1,this,uVar5,uVar5);
    val.dx_._0_8_ = &sum;
    val.val_ = (double)&sum_1;
    Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
              (&tmp,(FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)&val);
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(this,uVar5,uVar5,&tmp);
    Fad<double>::~Fad(&tmp);
    Fad<double>::~Fad(&sum_1);
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&tmp,this,uVar5,uVar5);
    Fad<double>::Fad(&local_50,&tmp);
    dVar2 = ABS(local_50.val_);
    Fad<double>::~Fad(&local_50);
    if (dVar2 < 1e-12) {
      Error("Decompose_LDLt <Zero on diagonal>",(char *)0x0);
    }
    for (lVar7 = local_150; (int)lVar7 < (int)uVar3; lVar7 = lVar7 + 1) {
      sum_1.val_ = 0.0;
      sum_1.dx_.num_elts = 0;
      sum_1.dx_.ptr_to_data = (double *)0x0;
      sum_1.defaultVal = 0.0;
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&val,this,uVar6,uVar6);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  ((Fad<double> *)local_70,this,uVar5,uVar6);
        local_a0._0_8_ = &val;
        local_a0._8_8_ = (Fad<double> *)local_70;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  ((Fad<double> *)local_100,this,lVar7,uVar6);
        local_140._0_8_ = local_a0;
        local_140._8_8_ = (Fad<double> *)local_100;
        Fad<double>::operator+=
                  (&sum_1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                           *)local_140);
        Fad<double>::~Fad((Fad<double> *)local_100);
        Fad<double>::~Fad((Fad<double> *)local_70);
        Fad<double>::~Fad(&val);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                ((Fad<double> *)local_70,this,lVar7,uVar5);
      local_100._0_8_ = local_140;
      local_100._8_8_ = &tmp;
      local_140._0_8_ = (Fad<double> *)local_70;
      local_140._8_8_ = &sum_1;
      Fad<double>::Fad<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,Fad<double>>>,Fad<double>>>
                (&val,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)local_100);
      Fad<double>::~Fad((Fad<double> *)local_70);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(this,lVar7,uVar5,&val);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(this,uVar5,lVar7,&val);
      Fad<double>::~Fad(&val);
      Fad<double>::~Fad(&sum_1);
    }
    Fad<double>::~Fad(&tmp);
    Fad<double>::~Fad(&sum);
    local_150 = local_150 + 1;
    uVar5 = uVar5 + 1;
  }
  (this->super_TPZBaseMatrix).fDecomposed = '\x04';
  (this->super_TPZBaseMatrix).fDefPositive = '\0';
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LDLt() {
	
	if (  fDecomposed && fDecomposed != ELDLt) {
		Error( "Decompose_LDLt <Matrix already Decomposed with other scheme> " );
	} else if(fDecomposed ) {
		return ELDLt;
	}
	if ( Rows()!=Cols() ) Error( "Decompose_LDLt <Matrix must be square>" );
	
	const int dim=Rows();
	
	for (auto j = 0; j < dim; j++ ) {
        TVar sum = 0;
		for (auto k=0; k<j; k++) {
            if constexpr(is_complex<TVar>::value){
                sum +=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
            }else{
                sum +=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
            }   
		}
        PutVal( j,j,GetVal(j,j) - sum );
		TVar tmp = GetVal(j,j);
		if ( IsZero(tmp) ) Error( "Decompose_LDLt <Zero on diagonal>" );
        for(auto l=j+1; l<dim;l++) {
            TVar sum = 0;
            for (auto k=0; k<j; k++) {
                if constexpr(is_complex<TVar>::value){
                    sum += GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
                }else{
                    sum += GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
                }
			}
            TVar val = (GetVal(l,j) - sum)/tmp;
            PutVal(l,j,val);
            if constexpr(is_complex<TVar>::value){val=std::conj(val);}
            PutVal(j,l,val);
		}
	}
	fDecomposed  = ELDLt;
	fDefPositive = 0;
	return( 1 );
}